

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O0

int __thiscall jrtplib::RTPPacketBuilder::DeleteCSRC(RTPPacketBuilder *this,uint32_t csrc)

{
  bool bVar1;
  bool bVar2;
  int local_20;
  bool found;
  int i;
  uint32_t csrc_local;
  RTPPacketBuilder *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x14;
  }
  else {
    local_20 = 0;
    bVar2 = false;
    while( true ) {
      bVar1 = false;
      if (!bVar2) {
        bVar1 = local_20 < this->numcsrcs;
      }
      if (!bVar1) break;
      if (this->csrcs[local_20] == csrc) {
        bVar2 = true;
      }
      else {
        local_20 = local_20 + 1;
      }
    }
    if (bVar2) {
      this->numcsrcs = this->numcsrcs + -1;
      if ((0 < this->numcsrcs) && (this->numcsrcs != local_20)) {
        this->csrcs[local_20] = this->csrcs[this->numcsrcs];
      }
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = -0xf;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPPacketBuilder::DeleteCSRC(uint32_t csrc)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	
	int i = 0;
	bool found = false;

	while (!found && i < numcsrcs)
	{
		if (csrcs[i] == csrc)
			found = true;
		else
			i++;
	}

	if (!found)
		return ERR_RTP_PACKBUILD_CSRCNOTINLIST;
	
	// move the last csrc in the place of the deleted one
	numcsrcs--;
	if (numcsrcs > 0 && numcsrcs != i)
		csrcs[i] = csrcs[numcsrcs];
	return 0;
}